

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitTableFill
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,TableFill *curr)

{
  Type type_00;
  Table *pTVar1;
  Type type;
  TableFill *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  
  pTVar1 = Module::getTable(this->wasm,(Name)(curr->table).super_IString.str);
  type_00.id = (pTVar1->type).id;
  noteTableIndex(this,&curr->dest,(Name)(curr->table).super_IString.str);
  note(this,&curr->value,type_00);
  noteTableIndex(this,&curr->size,(Name)(curr->table).super_IString.str);
  return;
}

Assistant:

void visitTableFill(TableFill* curr) {
    auto type = wasm.getTable(curr->table)->type;
    noteTableIndex(&curr->dest, curr->table);
    note(&curr->value, type);
    noteTableIndex(&curr->size, curr->table);
  }